

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::JobManager::CreateJob
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr,uint64_t aXpanId)

{
  pointer *pppJVar1;
  Interpreter *aInterpreter;
  iterator __position;
  pointer pbVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *p_Var3;
  const_iterator cVar4;
  Job *this_00;
  char *pcVar5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  Job *job;
  JobEvaluator eval;
  format_string_checker<char> local_e8;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  CommissionerAppPtr *local_98;
  uint64_t local_90;
  _Any_data local_88;
  code *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_98 = aCommissioner;
  local_90 = aXpanId;
  utils::ToLower((string *)&local_e8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  p_Var3 = Interpreter::mJobEvaluatorMap_abi_cxx11_;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
          ::find(Interpreter::mJobEvaluatorMap_abi_cxx11_,(key_type *)&local_e8);
  if ((size_t *)local_e8._0_8_ !=
      &local_e8.context_.super_basic_format_parse_context<char>.format_str_.size_) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((_Rb_tree_header *)cVar4._M_node == &(p_Var3->_M_impl).super__Rb_tree_header) {
    local_e8.types_[0] = 0xd;
    local_e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "{} not eligible for job";
    local_e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x17;
    local_e8.context_.super_basic_format_parse_context<char>._16_8_ = 0x100000000;
    local_e8.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    begin = "{} not eligible for job";
    local_e8.context_.types_ = local_e8.types_;
    do {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",&local_e8);
      }
      begin = pcVar5;
    } while (pcVar5 != "");
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_e8._0_8_ = (pbVar2->_M_dataplus)._M_p;
    local_e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)pbVar2->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x17;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_e8;
    ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"{} not eligible for job",fmt,args);
    __return_storage_ptr__->mCode = kInvalidCommand;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator=((function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)&local_b8,
                (function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)(cVar4._M_node + 2));
    this_00 = (Job *)operator_new(0xa0);
    aInterpreter = this->mInterpreter;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,aExpr);
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function((function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_88,
               (function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_b8);
    Job::Job(this_00,aInterpreter,local_98,&local_68,(JobEvaluator *)&local_88,local_90);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    __position._M_current =
         (this->mJobPool).
         super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_e8._0_8_ = this_00;
    if (__position._M_current ==
        (this->mJobPool).
        super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ot::commissioner::Job*,std::allocator<ot::commissioner::Job*>>::
      _M_realloc_insert<ot::commissioner::Job*const&>
                ((vector<ot::commissioner::Job*,std::allocator<ot::commissioner::Job*>> *)this,
                 __position,(Job **)&local_e8);
    }
    else {
      *__position._M_current = this_00;
      pppJVar1 = &(this->mJobPool).
                  super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppJVar1 = *pppJVar1 + 1;
    }
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::CreateJob(CommissionerAppPtr &aCommissioner, const Interpreter::Expression &aExpr, uint64_t aXpanId)
{
    Interpreter::JobEvaluator eval;
    auto                      mapItem = Interpreter::mJobEvaluatorMap.find(utils::ToLower(aExpr[0]));

    if (mapItem == Interpreter::mJobEvaluatorMap.end())
    {
        return ERROR_INVALID_COMMAND("{} not eligible for job", aExpr[0]);
    }
    eval     = mapItem->second;
    Job *job = new Job(mInterpreter, aCommissioner, aExpr, eval, aXpanId);
    mJobPool.push_back(job);

    return ERROR_NONE;
}